

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toupperhashstrategy.cpp
# Opt level: O0

char * __thiscall ToUpperHashStrategy::hash(ToUpperHashStrategy *this,char *str)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  char *__s;
  int local_2c;
  int i;
  char *res;
  int len;
  char *str_local;
  ToUpperHashStrategy *this_local;
  
  sVar3 = strlen(str);
  iVar2 = (int)sVar3;
  __s = (char *)operator_new__((long)(iVar2 + 1));
  memset(__s,0,(long)(iVar2 + 1));
  for (local_2c = 0; local_2c < iVar2; local_2c = local_2c + 1) {
    cVar1 = toUpper(str[local_2c]);
    __s[local_2c] = cVar1;
  }
  return __s;
}

Assistant:

char* ToUpperHashStrategy::hash(const char* str)
{
	int len = strlen(str);
	char* res = new char[len + 1];
	memset(res, 0x00, len + 1);

	for (int i = 0; i < len; ++i) {
		res[i] = toUpper(str[i]);
	}

	return res;

}